

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::make
          (GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *this,string *name)

{
  Program *this_00;
  mapped_type *this_01;
  SharedPtr<deqp::gls::LongStressCaseInternal::Program> SStack_28;
  
  this_00 = (Program *)operator_new(0x50);
  LongStressCaseInternal::Program::Program(this_00);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>::SharedPtr(&SStack_28,this_00);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>_>
            ::operator[](&this->m_objects,name);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>::operator=(this_01,&SStack_28);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>::~SharedPtr(&SStack_28);
  return;
}

Assistant:

void						make						(const string& name)								{ DE_ASSERT(!has(name)); m_objects[name] = SharedPtr<T>(new T); }